

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::tessellation::anon_unknown_2::IdentityTessellationShaderTestCase::createInstance
          (IdentityTessellationShaderTestCase *this,Context *context)

{
  PassthroughTestInstance *this_00;
  Vector<float,_4> local_184;
  Vector<float,_4> local_174;
  Vector<float,_4> local_158;
  undefined1 local_148 [8];
  Params params;
  Context *context_local;
  IdentityTessellationShaderTestCase *this_local;
  
  params.message.field_2._8_8_ = context;
  PassthroughTestInstance::Params::Params((Params *)local_148);
  local_148[0] = false;
  params.tessLevels.outer[2] = (float)this->m_primitiveType;
  params.tessLevels.outer[3] = (float)((this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) + 2);
  tcu::Vector<float,_4>::Vector(&local_158,-0.4,0.4,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &params.inputPatchVertices,&local_158);
  tcu::Vector<float,_4>::Vector(&local_174,0.0,-0.5,0.0,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &params.inputPatchVertices,&local_174);
  if (params.tessLevels.outer[3] == 4.2039e-45) {
    tcu::Vector<float,_4>::Vector(&local_184,0.4,0.4,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &params.inputPatchVertices,&local_184);
  }
  params.vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
  params.vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
  std::__cxx11::string::operator=((string *)params.pipelineCases,"tese");
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[0].tessEvalShaderName.field_2._M_local_buf + 8),
             "geom_from_tese");
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[0].geomShaderName.field_2._M_local_buf + 8),
             "passthrough tessellation shaders");
  params.pipelineCases[0].description.field_2._M_local_buf[8] = '\0';
  params.pipelineCases[0].description.field_2._M_local_buf[9] = '\x01';
  std::__cxx11::string::operator=((string *)(params.pipelineCases + 1),"tese");
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[1].tessEvalShaderName.field_2._M_local_buf + 8),
             "geom_from_vert");
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[1].geomShaderName.field_2._M_local_buf + 8),
             "no tessellation shaders in the pipeline");
  std::__cxx11::string::operator=
            ((string *)(params.pipelineCases[1].description.field_2._M_local_buf + 8),
             "Testing geometry shading shader program output does not change when a passthrough tessellation shader is attached.\nRendering two images, first with and second without a tessellation shader. Expecting similar results.\nUsing additive blending to detect overlap.\n"
            );
  this_00 = (PassthroughTestInstance *)operator_new(0x140);
  PassthroughTestInstance::PassthroughTestInstance
            (this_00,(Context *)params.message.field_2._8_8_,(Params *)local_148);
  PassthroughTestInstance::Params::~Params((Params *)local_148);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* IdentityTessellationShaderTestCase::createInstance (Context& context) const
{
	PassthroughTestInstance::Params params;

	params.useTessLevels	   = false;
	params.primitiveType	   = m_primitiveType;
	params.inputPatchVertices  = (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

	params.vertices.push_back(	  tcu::Vec4( -0.4f,  0.4f, 0.0f, 1.0f ));
	params.vertices.push_back(	  tcu::Vec4(  0.0f, -0.5f, 0.0f, 1.0f ));
	if (params.inputPatchVertices == 3)
		params.vertices.push_back(tcu::Vec4(  0.4f,  0.4f, 0.0f, 1.0f ));

	params.pipelineCases[0].useTessellation		= true;
	params.pipelineCases[0].useGeometry			= true;
	params.pipelineCases[0].tessEvalShaderName	= "tese";
	params.pipelineCases[0].geomShaderName		= "geom_from_tese";
	params.pipelineCases[0].description			= "passthrough tessellation shaders";

	params.pipelineCases[1].useTessellation		= false;
	params.pipelineCases[1].useGeometry			= true;
	params.pipelineCases[1].tessEvalShaderName	= "tese";
	params.pipelineCases[1].geomShaderName		= "geom_from_vert";
	params.pipelineCases[1].description			= "no tessellation shaders in the pipeline";

	params.message = "Testing geometry shading shader program output does not change when a passthrough tessellation shader is attached.\n"
					 "Rendering two images, first with and second without a tessellation shader. Expecting similar results.\n"
					 "Using additive blending to detect overlap.\n";

	return new PassthroughTestInstance(context, params);
}